

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall
sptk::ScalarOperation::AddLowerBoundingOperation(ScalarOperation *this,double lower_bound)

{
  OperationInterface *operation;
  long in_RDI;
  OperationPerformer *this_00;
  
  operation = (OperationInterface *)(in_RDI + 0x10);
  this_00 = (OperationPerformer *)0x10;
  operator_new(0x10);
  operator_new((ulong)this_00);
  anon_unknown.dwarf_5ae6::LowerBounding::LowerBounding((LowerBounding *)this_00,(double)operation);
  anon_unknown.dwarf_5ae6::OperationPerformer::OperationPerformer(this_00,operation);
  std::
  vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
  ::push_back((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
               *)this_00,(value_type *)operation);
  return true;
}

Assistant:

bool ScalarOperation::AddLowerBoundingOperation(double lower_bound) {
  modules_.push_back(new OperationPerformer(new LowerBounding(lower_bound)));
  return true;
}